

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_linear_resampler_process_pcm_frames
                    (ma_linear_resampler *pResampler,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ma_format mVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ma_uint64 mVar14;
  float *pfVar15;
  ma_lpf1 *pmVar16;
  ma_biquad_coefficient *pmVar17;
  ma_lpf2 *pmVar18;
  ma_uint32 mVar19;
  uint uVar20;
  ma_result mVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  ma_uint64 mVar28;
  undefined2 uVar29;
  int iVar30;
  int iVar31;
  ma_uint64 mVar32;
  ma_int16 mVar33;
  float fVar34;
  float fVar35;
  ma_uint64 local_80;
  
  if (pResampler == (ma_linear_resampler *)0x0) {
    mVar21 = MA_INVALID_ARGS;
  }
  else {
    mVar7 = (pResampler->config).format;
    if (mVar7 == ma_format_f32) {
      uVar20 = (pResampler->config).sampleRateOut;
      if (uVar20 < (pResampler->config).sampleRateIn) {
        if (pFrameCountIn == (ma_uint64 *)0x0) {
          __assert_fail("pFrameCountIn != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                        ,0x97ee,
                        "ma_result ma_linear_resampler_process_pcm_frames_f32_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                       );
        }
        if (pFrameCountOut == (ma_uint64 *)0x0) {
          __assert_fail("pFrameCountOut != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                        ,0x97ef,
                        "ma_result ma_linear_resampler_process_pcm_frames_f32_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                       );
        }
        uVar13 = *pFrameCountIn;
        mVar14 = *pFrameCountOut;
        local_80 = 0;
        mVar28 = 0;
        while (mVar32 = mVar14, mVar28 != mVar14) {
          mVar19 = pResampler->inTimeInt;
          while ((mVar19 != 0 && (local_80 < uVar13))) {
            uVar26 = (ulong)(pResampler->config).channels;
            uVar25 = 0;
            if (pFramesIn == (void *)0x0) {
              for (; uVar26 != uVar25; uVar25 = uVar25 + 1) {
                (pResampler->x0).f32[uVar25] = (pResampler->x1).f32[uVar25];
                (pResampler->x1).f32[uVar25] = 0.0;
              }
              pFramesIn = (void *)0x0;
            }
            else {
              for (; uVar26 != uVar25; uVar25 = uVar25 + 1) {
                (pResampler->x0).f32[uVar25] = (pResampler->x1).f32[uVar25];
                (pResampler->x1).f32[uVar25] = *(float *)((long)pFramesIn + uVar25 * 4);
              }
              pFramesIn = (void *)((long)pFramesIn + uVar26 * 4);
            }
            if ((pResampler->lpf).format != ma_format_f32) goto LAB_00192ba9;
            pfVar15 = (pResampler->x1).f32;
            for (uVar26 = 0; uVar26 < (pResampler->lpf).lpf1Count; uVar26 = uVar26 + 1) {
              pmVar16 = (pResampler->lpf).pLPF1;
              uVar20 = pmVar16[uVar26].channels;
              fVar1 = pmVar16[uVar26].a.f32;
              for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                pmVar17 = pmVar16[uVar26].pR1;
                fVar34 = pfVar15[uVar25] * (1.0 - fVar1) + pmVar17[uVar25].f32 * fVar1;
                pfVar15[uVar25] = fVar34;
                pmVar17[uVar25].f32 = fVar34;
              }
            }
            for (uVar26 = 0; uVar26 < (pResampler->lpf).lpf2Count; uVar26 = uVar26 + 1) {
              pmVar18 = (pResampler->lpf).pLPF2;
              uVar20 = pmVar18[uVar26].bq.channels;
              fVar1 = pmVar18[uVar26].bq.b0.f32;
              fVar34 = pmVar18[uVar26].bq.b1.f32;
              fVar2 = pmVar18[uVar26].bq.b2.f32;
              fVar3 = pmVar18[uVar26].bq.a1.f32;
              fVar4 = pmVar18[uVar26].bq.a2.f32;
              for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                pmVar17 = pmVar18[uVar26].bq.pR1;
                fVar5 = pfVar15[uVar25];
                fVar35 = fVar1 * fVar5 + pmVar17[uVar25].f32;
                fVar6 = pmVar18[uVar26].bq.pR2[uVar25].f32;
                pfVar15[uVar25] = fVar35;
                pmVar17[uVar25].f32 = fVar34 * fVar5 + fVar35 * -fVar3 + fVar6;
                pmVar18[uVar26].bq.pR2[uVar25].f32 = fVar5 * fVar2 + fVar35 * -fVar4;
              }
            }
            local_80 = local_80 + 1;
            mVar19 = pResampler->inTimeInt - 1;
            pResampler->inTimeInt = mVar19;
          }
          mVar32 = mVar28;
          if (mVar19 != 0) break;
          if ((float *)pFramesOut == (float *)0x0) {
            mVar19 = 0;
            pFramesOut = (float *)0x0;
          }
          else {
            ma_linear_resampler_interpolate_frame_f32(pResampler,(float *)pFramesOut);
            mVar19 = pResampler->inTimeInt;
            pFramesOut = (void *)((long)pFramesOut + (ulong)(pResampler->config).channels * 4);
          }
          mVar19 = mVar19 + pResampler->inAdvanceInt;
          mVar28 = mVar28 + 1;
          pResampler->inTimeInt = mVar19;
          uVar20 = (pResampler->config).sampleRateOut;
          uVar24 = pResampler->inTimeFrac + pResampler->inAdvanceFrac;
          pResampler->inTimeFrac = uVar24;
          if (uVar20 <= uVar24) {
            pResampler->inTimeFrac = uVar24 - uVar20;
            pResampler->inTimeInt = mVar19 + 1;
          }
        }
      }
      else {
        if (pFrameCountIn == (ma_uint64 *)0x0) {
          __assert_fail("pFrameCountIn != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                        ,0x9838,
                        "ma_result ma_linear_resampler_process_pcm_frames_f32_upsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                       );
        }
        if (pFrameCountOut == (ma_uint64 *)0x0) {
          __assert_fail("pFrameCountOut != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                        ,0x9839,
                        "ma_result ma_linear_resampler_process_pcm_frames_f32_upsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                       );
        }
        uVar13 = *pFrameCountIn;
        mVar14 = *pFrameCountOut;
        local_80 = 0;
        mVar28 = 0;
        while (mVar32 = mVar14, mVar28 != mVar14) {
          mVar19 = pResampler->inTimeInt;
          while ((mVar19 != 0 && (local_80 < uVar13))) {
            uVar26 = (ulong)(pResampler->config).channels;
            uVar25 = 0;
            if (pFramesIn == (void *)0x0) {
              for (; uVar26 != uVar25; uVar25 = uVar25 + 1) {
                (pResampler->x0).f32[uVar25] = (pResampler->x1).f32[uVar25];
                (pResampler->x1).f32[uVar25] = 0.0;
              }
              pFramesIn = (void *)0x0;
            }
            else {
              for (; uVar26 != uVar25; uVar25 = uVar25 + 1) {
                (pResampler->x0).f32[uVar25] = (pResampler->x1).f32[uVar25];
                (pResampler->x1).f32[uVar25] = *(float *)((long)pFramesIn + uVar25 * 4);
              }
              pFramesIn = (void *)((long)pFramesIn + uVar26 * 4);
            }
            local_80 = local_80 + 1;
            mVar19 = mVar19 - 1;
            pResampler->inTimeInt = mVar19;
          }
          mVar32 = mVar28;
          if (mVar19 != 0) break;
          if ((float *)pFramesOut == (float *)0x0) {
            mVar19 = 0;
            pFramesOut = (float *)0x0;
          }
          else {
            ma_linear_resampler_interpolate_frame_f32(pResampler,(float *)pFramesOut);
            if ((pResampler->lpf).format != ma_format_f32) {
LAB_00192ba9:
              __assert_fail("pLPF->format == ma_format_f32",
                            "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                            ,0x84e1,
                            "void ma_lpf_process_pcm_frame_f32(ma_lpf *, float *, const void *)");
            }
            for (uVar26 = 0; uVar26 < (pResampler->lpf).lpf1Count; uVar26 = uVar26 + 1) {
              pmVar16 = (pResampler->lpf).pLPF1;
              uVar20 = pmVar16[uVar26].channels;
              fVar1 = pmVar16[uVar26].a.f32;
              for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                pmVar17 = pmVar16[uVar26].pR1;
                fVar34 = *(float *)((long)pFramesOut + uVar25 * 4) * (1.0 - fVar1) +
                         pmVar17[uVar25].f32 * fVar1;
                *(float *)((long)pFramesOut + uVar25 * 4) = fVar34;
                pmVar17[uVar25].f32 = fVar34;
              }
            }
            for (uVar26 = 0; uVar26 < (pResampler->lpf).lpf2Count; uVar26 = uVar26 + 1) {
              pmVar18 = (pResampler->lpf).pLPF2;
              uVar20 = pmVar18[uVar26].bq.channels;
              fVar1 = pmVar18[uVar26].bq.b0.f32;
              fVar34 = pmVar18[uVar26].bq.b1.f32;
              fVar2 = pmVar18[uVar26].bq.b2.f32;
              fVar3 = pmVar18[uVar26].bq.a1.f32;
              fVar4 = pmVar18[uVar26].bq.a2.f32;
              for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                pmVar17 = pmVar18[uVar26].bq.pR1;
                fVar5 = *(float *)((long)pFramesOut + uVar25 * 4);
                fVar35 = fVar1 * fVar5 + pmVar17[uVar25].f32;
                fVar6 = pmVar18[uVar26].bq.pR2[uVar25].f32;
                *(float *)((long)pFramesOut + uVar25 * 4) = fVar35;
                pmVar17[uVar25].f32 = fVar34 * fVar5 + fVar35 * -fVar3 + fVar6;
                pmVar18[uVar26].bq.pR2[uVar25].f32 = fVar5 * fVar2 + fVar35 * -fVar4;
              }
            }
            uVar20 = (pResampler->config).sampleRateOut;
            pFramesOut = (void *)((long)pFramesOut + (ulong)(pResampler->config).channels * 4);
            mVar19 = pResampler->inTimeInt;
          }
          mVar28 = mVar28 + 1;
          mVar19 = mVar19 + pResampler->inAdvanceInt;
          pResampler->inTimeInt = mVar19;
          uVar24 = pResampler->inTimeFrac + pResampler->inAdvanceFrac;
          pResampler->inTimeFrac = uVar24;
          if (uVar20 <= uVar24) {
            pResampler->inTimeFrac = uVar24 - uVar20;
            pResampler->inTimeInt = mVar19 + 1;
          }
        }
      }
    }
    else {
      if (mVar7 != ma_format_s16) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x9890,
                      "ma_result ma_linear_resampler_process_pcm_frames(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      uVar20 = (pResampler->config).sampleRateOut;
      if (uVar20 < (pResampler->config).sampleRateIn) {
        if (pFrameCountIn == (ma_uint64 *)0x0) {
          __assert_fail("pFrameCountIn != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                        ,0x974e,
                        "ma_result ma_linear_resampler_process_pcm_frames_s16_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                       );
        }
        if (pFrameCountOut == (ma_uint64 *)0x0) {
          __assert_fail("pFrameCountOut != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                        ,0x974f,
                        "ma_result ma_linear_resampler_process_pcm_frames_s16_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                       );
        }
        uVar13 = *pFrameCountIn;
        mVar14 = *pFrameCountOut;
        local_80 = 0;
        mVar28 = 0;
        while (mVar32 = mVar14, mVar28 != mVar14) {
          mVar19 = pResampler->inTimeInt;
          while ((mVar19 != 0 && (local_80 < uVar13))) {
            uVar26 = (ulong)(pResampler->config).channels;
            uVar25 = 0;
            if (pFramesIn == (void *)0x0) {
              for (; uVar26 != uVar25; uVar25 = uVar25 + 1) {
                *(undefined2 *)((long)(pResampler->x0).f32 + uVar25 * 2) =
                     *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2);
                *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2) = 0;
              }
              pFramesIn = (void *)0x0;
            }
            else {
              for (; uVar26 != uVar25; uVar25 = uVar25 + 1) {
                *(undefined2 *)((long)(pResampler->x0).f32 + uVar25 * 2) =
                     *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2);
                *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2) =
                     *(undefined2 *)((long)pFramesIn + uVar25 * 2);
              }
              pFramesIn = (void *)((long)pFramesIn + uVar26 * 2);
            }
            if ((pResampler->lpf).format != ma_format_s16) goto LAB_00192b8a;
            pfVar15 = (pResampler->x1).f32;
            for (uVar26 = 0; uVar26 < (pResampler->lpf).lpf1Count; uVar26 = uVar26 + 1) {
              pmVar16 = (pResampler->lpf).pLPF1;
              uVar20 = pmVar16[uVar26].channels;
              iVar8 = pmVar16[uVar26].a.s32;
              for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                pmVar17 = pmVar16[uVar26].pR1;
                iVar27 = pmVar17[uVar25].s32 * iVar8 +
                         (int)*(short *)((long)pfVar15 + uVar25 * 2) * (0x4000 - iVar8) >> 0xe;
                *(short *)((long)pfVar15 + uVar25 * 2) = (short)iVar27;
                pmVar17[uVar25].s32 = iVar27;
              }
            }
            for (uVar26 = 0; uVar26 < (pResampler->lpf).lpf2Count; uVar26 = uVar26 + 1) {
              pmVar18 = (pResampler->lpf).pLPF2;
              uVar20 = pmVar18[uVar26].bq.channels;
              iVar8 = pmVar18[uVar26].bq.b0.s32;
              iVar27 = pmVar18[uVar26].bq.b1.s32;
              iVar9 = pmVar18[uVar26].bq.b2.s32;
              iVar10 = pmVar18[uVar26].bq.a1.s32;
              iVar11 = pmVar18[uVar26].bq.a2.s32;
              for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                pmVar17 = pmVar18[uVar26].bq.pR1;
                iVar31 = (int)*(short *)((long)pfVar15 + uVar25 * 2);
                iVar30 = iVar8 * iVar31 + pmVar17[uVar25].s32 >> 0xe;
                iVar12 = pmVar18[uVar26].bq.pR2[uVar25].s32;
                iVar22 = iVar10 * iVar30;
                iVar23 = iVar30 * iVar11;
                if (0x7ffe < iVar30) {
                  iVar30 = 0x7fff;
                }
                uVar29 = (undefined2)iVar30;
                if (iVar30 < -0x7fff) {
                  uVar29 = 0x8000;
                }
                *(undefined2 *)((long)pfVar15 + uVar25 * 2) = uVar29;
                pmVar17[uVar25].s32 = (iVar27 * iVar31 + iVar12) - iVar22;
                pmVar18[uVar26].bq.pR2[uVar25].s32 = iVar31 * iVar9 - iVar23;
              }
            }
            local_80 = local_80 + 1;
            mVar19 = pResampler->inTimeInt - 1;
            pResampler->inTimeInt = mVar19;
          }
          mVar32 = mVar28;
          if (mVar19 != 0) break;
          if ((ma_int16 *)pFramesOut == (ma_int16 *)0x0) {
            mVar19 = 0;
            pFramesOut = (ma_int16 *)0x0;
          }
          else {
            ma_linear_resampler_interpolate_frame_s16(pResampler,(ma_int16 *)pFramesOut);
            mVar19 = pResampler->inTimeInt;
            pFramesOut = (void *)((long)pFramesOut + (ulong)(pResampler->config).channels * 2);
          }
          mVar19 = mVar19 + pResampler->inAdvanceInt;
          mVar28 = mVar28 + 1;
          pResampler->inTimeInt = mVar19;
          uVar20 = (pResampler->config).sampleRateOut;
          uVar24 = pResampler->inTimeFrac + pResampler->inAdvanceFrac;
          pResampler->inTimeFrac = uVar24;
          if (uVar20 <= uVar24) {
            pResampler->inTimeFrac = uVar24 - uVar20;
            pResampler->inTimeInt = mVar19 + 1;
          }
        }
      }
      else {
        if (pFrameCountIn == (ma_uint64 *)0x0) {
          __assert_fail("pFrameCountIn != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                        ,0x9798,
                        "ma_result ma_linear_resampler_process_pcm_frames_s16_upsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                       );
        }
        if (pFrameCountOut == (ma_uint64 *)0x0) {
          __assert_fail("pFrameCountOut != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                        ,0x9799,
                        "ma_result ma_linear_resampler_process_pcm_frames_s16_upsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                       );
        }
        uVar13 = *pFrameCountIn;
        mVar14 = *pFrameCountOut;
        local_80 = 0;
        mVar28 = 0;
        while (mVar32 = mVar14, mVar28 != mVar14) {
          mVar19 = pResampler->inTimeInt;
          while ((mVar19 != 0 && (local_80 < uVar13))) {
            uVar26 = (ulong)(pResampler->config).channels;
            uVar25 = 0;
            if (pFramesIn == (void *)0x0) {
              for (; uVar26 != uVar25; uVar25 = uVar25 + 1) {
                *(undefined2 *)((long)(pResampler->x0).f32 + uVar25 * 2) =
                     *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2);
                *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2) = 0;
              }
              pFramesIn = (void *)0x0;
            }
            else {
              for (; uVar26 != uVar25; uVar25 = uVar25 + 1) {
                *(undefined2 *)((long)(pResampler->x0).f32 + uVar25 * 2) =
                     *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2);
                *(undefined2 *)((long)(pResampler->x1).f32 + uVar25 * 2) =
                     *(undefined2 *)((long)pFramesIn + uVar25 * 2);
              }
              pFramesIn = (void *)((long)pFramesIn + uVar26 * 2);
            }
            local_80 = local_80 + 1;
            mVar19 = mVar19 - 1;
            pResampler->inTimeInt = mVar19;
          }
          mVar32 = mVar28;
          if (mVar19 != 0) break;
          if ((ma_int16 *)pFramesOut == (ma_int16 *)0x0) {
            mVar19 = 0;
            pFramesOut = (ma_int16 *)0x0;
          }
          else {
            ma_linear_resampler_interpolate_frame_s16(pResampler,(ma_int16 *)pFramesOut);
            if ((pResampler->lpf).format != ma_format_s16) {
LAB_00192b8a:
              __assert_fail("pLPF->format == ma_format_s16",
                            "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                            ,0x84f3,
                            "void ma_lpf_process_pcm_frame_s16(ma_lpf *, ma_int16 *, const ma_int16 *)"
                           );
            }
            for (uVar26 = 0; uVar26 < (pResampler->lpf).lpf1Count; uVar26 = uVar26 + 1) {
              pmVar16 = (pResampler->lpf).pLPF1;
              uVar20 = pmVar16[uVar26].channels;
              iVar8 = pmVar16[uVar26].a.s32;
              for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                pmVar17 = pmVar16[uVar26].pR1;
                iVar27 = pmVar17[uVar25].s32 * iVar8 +
                         (int)*(short *)((long)pFramesOut + uVar25 * 2) * (0x4000 - iVar8) >> 0xe;
                *(ma_int16 *)((long)pFramesOut + uVar25 * 2) = (ma_int16)iVar27;
                pmVar17[uVar25].s32 = iVar27;
              }
            }
            for (uVar26 = 0; uVar26 < (pResampler->lpf).lpf2Count; uVar26 = uVar26 + 1) {
              pmVar18 = (pResampler->lpf).pLPF2;
              uVar20 = pmVar18[uVar26].bq.channels;
              iVar8 = pmVar18[uVar26].bq.b0.s32;
              iVar27 = pmVar18[uVar26].bq.b1.s32;
              iVar9 = pmVar18[uVar26].bq.b2.s32;
              iVar10 = pmVar18[uVar26].bq.a1.s32;
              iVar11 = pmVar18[uVar26].bq.a2.s32;
              for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
                pmVar17 = pmVar18[uVar26].bq.pR1;
                iVar22 = (int)*(short *)((long)pFramesOut + uVar25 * 2);
                iVar31 = iVar8 * iVar22 + pmVar17[uVar25].s32 >> 0xe;
                iVar12 = pmVar18[uVar26].bq.pR2[uVar25].s32;
                iVar23 = iVar10 * iVar31;
                iVar30 = iVar31 * iVar11;
                if (0x7ffe < iVar31) {
                  iVar31 = 0x7fff;
                }
                mVar33 = (ma_int16)iVar31;
                if (iVar31 < -0x7fff) {
                  mVar33 = -0x8000;
                }
                *(ma_int16 *)((long)pFramesOut + uVar25 * 2) = mVar33;
                pmVar17[uVar25].s32 = (iVar27 * iVar22 + iVar12) - iVar23;
                pmVar18[uVar26].bq.pR2[uVar25].s32 = iVar22 * iVar9 - iVar30;
              }
            }
            uVar20 = (pResampler->config).sampleRateOut;
            pFramesOut = (void *)((long)pFramesOut + (ulong)(pResampler->config).channels * 2);
            mVar19 = pResampler->inTimeInt;
          }
          mVar28 = mVar28 + 1;
          mVar19 = mVar19 + pResampler->inAdvanceInt;
          pResampler->inTimeInt = mVar19;
          uVar24 = pResampler->inTimeFrac + pResampler->inAdvanceFrac;
          pResampler->inTimeFrac = uVar24;
          if (uVar20 <= uVar24) {
            pResampler->inTimeFrac = uVar24 - uVar20;
            pResampler->inTimeInt = mVar19 + 1;
          }
        }
      }
    }
    *pFrameCountIn = local_80;
    *pFrameCountOut = mVar32;
    mVar21 = MA_SUCCESS;
  }
  return mVar21;
}

Assistant:

MA_API ma_result ma_linear_resampler_process_pcm_frames(ma_linear_resampler* pResampler, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    /*  */ if (pResampler->config.format == ma_format_s16) {
        return ma_linear_resampler_process_pcm_frames_s16(pResampler, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
    } else if (pResampler->config.format == ma_format_f32) {
        return ma_linear_resampler_process_pcm_frames_f32(pResampler, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
    } else {
        /* Should never get here. Getting here means the format is not supported and you didn't check the return value of ma_linear_resampler_init(). */
        MA_ASSERT(MA_FALSE);
        return MA_INVALID_ARGS;
    }
}